

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

void __thiscall
testing::internal::PairMatcherImpl<std::pair<std::__cxx11::string,std::__cxx11::string>const&>::
PairMatcherImpl<char_const*,char_const*>
          (PairMatcherImpl<std::pair<std::__cxx11::string,std::__cxx11::string>const&> *this,
          char *first_matcher,char *second_matcher)

{
  *(undefined ***)this = &PTR__PairMatcherImpl_001bc8a0;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)(this + 8),first_matcher);
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)(this + 0x20),second_matcher);
  return;
}

Assistant:

PairMatcherImpl(FirstMatcher first_matcher, SecondMatcher second_matcher)
      : first_matcher_(
            testing::SafeMatcherCast<const FirstType&>(first_matcher)),
        second_matcher_(
            testing::SafeMatcherCast<const SecondType&>(second_matcher)) {}